

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

void __thiscall Func::TryCodegen(Func *this)

{
  uint uVar1;
  PAL_FILE *file;
  DataChunk *pDVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  JITTimeFunctionBody *pJVar6;
  JITTimeWorkItem *this_00;
  FunctionJITTimeInfo *topFunc;
  PageAllocator *pageAllocator;
  FlowGraph *pFVar7;
  ScriptContext *this_01;
  NativeCodeGenerator *pNVar8;
  undefined4 *puVar9;
  Allocator *pAVar10;
  JITOutputIDL *pJVar11;
  HANDLE pVVar12;
  NativeDataFixupTable *pNVar13;
  NativeDataBuffer *pNVar14;
  uint local_ee8;
  uint local_ee4;
  uint count;
  uint len;
  size_t allocSize;
  JITOutputIDL *jitOutputData;
  DataChunk *pDStack_ec8;
  uint i;
  DataChunk *next2;
  DataChunk *next1;
  DataChunk *chunk;
  Allocator *dataAllocator;
  AutoCodeGenPhase __autoCodeGen_16;
  PAL_FILE *openedFile;
  PAL_FILE *asmFile;
  PAL_FILE *oldFile;
  Encoder encoder;
  AutoCodeGenPhase __autoCodeGen_15;
  AutoCodeGenPhase __autoCodeGen_14;
  AutoCodeGenPhase __autoCodeGen_13;
  AutoCodeGenPhase __autoCodeGen_12;
  AutoCodeGenPhase __autoCodeGen_11;
  SimpleLayout layout;
  AutoCodeGenPhase __autoCodeGen_10;
  Peeps peeps;
  AutoCodeGenPhase __autoCodeGen_9;
  LinearScan linearScan;
  AutoCodeGenPhase __autoCodeGen_8;
  AutoCodeGenPhase __autoCodeGen_7;
  AutoCodeGenPhase __autoCodeGen_6;
  Security security;
  AutoCodeGenPhase __autoCodeGen_5;
  Lowerer lowerer;
  GlobOpt globOpt;
  AutoCodeGenPhase __autoCodeGen_4;
  AutoCodeGenPhase __autoCodeGen_3;
  NoRecoverMemoryJitArenaAllocator fgAlloc;
  Inline inliner;
  InliningHeuristics heuristics;
  AutoCodeGenPhase __autoCodeGen_2;
  IRBuilder irBuilder;
  IRBuilderAsmJs asmIrBuilder;
  undefined1 local_30 [8];
  AutoCodeGenPhase __autoCodeGen_1;
  AutoCodeGenPhase __autoCodeGen;
  Func *this_local;
  
  bVar4 = IsJitInDebugMode(this);
  if (bVar4) {
    pJVar6 = GetJITFunctionBody(this);
    bVar4 = JITTimeFunctionBody::HasTry(pJVar6);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x194,"(!IsJitInDebugMode() || !GetJITFunctionBody()->HasTry())",
                         "!IsJitInDebugMode() || !GetJITFunctionBody()->HasTry()");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
  }
  AutoCodeGenPhase::AutoCodeGenPhase((AutoCodeGenPhase *)&__autoCodeGen_1.phase,this,BackEndPhase);
  AutoCodeGenPhase::AutoCodeGenPhase((AutoCodeGenPhase *)local_30,this,IRBuilderPhase);
  pJVar6 = GetJITFunctionBody(this);
  bVar4 = JITTimeFunctionBody::IsAsmJsMode(pJVar6);
  if (bVar4) {
    IRBuilderAsmJs::IRBuilderAsmJs
              ((IRBuilderAsmJs *)&irBuilder.m_generatorJumpTable.m_generatorFrameOpnd,this);
    IRBuilderAsmJs::Build((IRBuilderAsmJs *)&irBuilder.m_generatorJumpTable.m_generatorFrameOpnd);
  }
  else {
    IRBuilder::IRBuilder((IRBuilder *)&__autoCodeGen_2.phase,this);
    IRBuilder::Build((IRBuilder *)&__autoCodeGen_2.phase);
    IRBuilder::~IRBuilder((IRBuilder *)&__autoCodeGen_2.phase);
  }
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)local_30,this,IRBuilderPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)local_30);
  AutoCodeGenPhase::AutoCodeGenPhase
            ((AutoCodeGenPhase *)&heuristics.threshold.constantArgumentInlineThreshold,this,
             InlinePhase);
  this_00 = GetWorkItem(this);
  topFunc = JITTimeWorkItem::GetJITTimeInfo(this_00);
  bVar4 = IsLoopBody(this);
  InliningHeuristics::InliningHeuristics
            ((InliningHeuristics *)&inliner.prevFrameCallInstr,topFunc,bVar4);
  Inline::Inline((Inline *)&fgAlloc.super_JitArenaAllocator.bvFreeList,this,
                 (InliningHeuristics *)&inliner.prevFrameCallInstr,0,0,false,(Inline *)0x0,
                 (Instr *)0x0);
  Inline::Optimize((Inline *)&fgAlloc.super_JitArenaAllocator.bvFreeList);
  AutoCodeGenPhase::EndPhase
            ((AutoCodeGenPhase *)&heuristics.threshold.constantArgumentInlineThreshold,this,
             InlinePhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase
            ((AutoCodeGenPhase *)&heuristics.threshold.constantArgumentInlineThreshold);
  ThrowIfScriptClosed(this);
  pageAllocator =
       Memory::ArenaData::GetPageAllocator
                 (&(this->m_alloc->super_ArenaAllocator).
                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                   super_ArenaData);
  Memory::NoRecoverMemoryJitArenaAllocator::NoRecoverMemoryJitArenaAllocator
            ((NoRecoverMemoryJitArenaAllocator *)&__autoCodeGen_3.phase,L"BE-FlowGraph",
             pageAllocator,Js::Throw::OutOfMemory);
  AutoCodeGenPhase::AutoCodeGenPhase((AutoCodeGenPhase *)&__autoCodeGen_4.phase,this,FGBuildPhase);
  pFVar7 = FlowGraph::New(this,(JitArenaAllocator *)&__autoCodeGen_3.phase);
  this->m_fg = pFVar7;
  FlowGraph::Build(this->m_fg);
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)&__autoCodeGen_4.phase,this,FGBuildPhase,true,true)
  ;
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)&__autoCodeGen_4.phase);
  AutoCodeGenPhase::AutoCodeGenPhase
            ((AutoCodeGenPhase *)&globOpt.byteCodeUsesBeforeOpt,this,GlobOptPhase);
  GlobOpt::GlobOpt((GlobOpt *)&lowerer.m_lowerGeneratorHelper.epilogueForBailOut,this);
  GlobOpt::Optimize((GlobOpt *)&lowerer.m_lowerGeneratorHelper.epilogueForBailOut);
  AutoCodeGenPhase::EndPhase
            ((AutoCodeGenPhase *)&globOpt.byteCodeUsesBeforeOpt,this,GlobOptPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)&globOpt.byteCodeUsesBeforeOpt);
  FlowGraph::Destroy(this->m_fg);
  this->m_fg = (FlowGraph *)0x0;
  Memory::NoRecoverMemoryJitArenaAllocator::~NoRecoverMemoryJitArenaAllocator
            ((NoRecoverMemoryJitArenaAllocator *)&__autoCodeGen_3.phase);
  ThrowIfScriptClosed(this);
  Lowerer::Lowerer((Lowerer *)&__autoCodeGen_5.phase,this);
  AutoCodeGenPhase::AutoCodeGenPhase((AutoCodeGenPhase *)&security.baseOpnd,this,LowererPhase);
  Lowerer::Lower((Lowerer *)&__autoCodeGen_5.phase);
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)&security.baseOpnd,this,LowererPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)&security.baseOpnd);
  Security::Security((Security *)&__autoCodeGen_6.phase,this);
  AutoCodeGenPhase::AutoCodeGenPhase
            ((AutoCodeGenPhase *)&__autoCodeGen_7.phase,this,EncodeConstantsPhase);
  Security::EncodeLargeConstants((Security *)&__autoCodeGen_6.phase);
  AutoCodeGenPhase::EndPhase
            ((AutoCodeGenPhase *)&__autoCodeGen_7.phase,this,EncodeConstantsPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)&__autoCodeGen_7.phase);
  pJVar6 = GetJITFunctionBody(this);
  bVar4 = JITTimeFunctionBody::DoInterruptProbe(pJVar6);
  if (bVar4) {
    AutoCodeGenPhase::AutoCodeGenPhase
              ((AutoCodeGenPhase *)&__autoCodeGen_8.phase,this,InterruptProbePhase);
    Lowerer::DoInterruptProbes((Lowerer *)&__autoCodeGen_5.phase);
    AutoCodeGenPhase::EndPhase
              ((AutoCodeGenPhase *)&__autoCodeGen_8.phase,this,InterruptProbePhase,true,true);
    AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)&__autoCodeGen_8.phase);
  }
  AutoCodeGenPhase::AutoCodeGenPhase
            ((AutoCodeGenPhase *)&linearScan.bailIn.tempRegOpnd,this,RegAllocPhase);
  LinearScan::LinearScan((LinearScan *)&__autoCodeGen_9.phase,this);
  LinearScan::RegAlloc((LinearScan *)&__autoCodeGen_9.phase);
  AutoCodeGenPhase::EndPhase
            ((AutoCodeGenPhase *)&linearScan.bailIn.tempRegOpnd,this,RegAllocPhase,true,true);
  LinearScan::~LinearScan((LinearScan *)&__autoCodeGen_9.phase);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)&linearScan.bailIn.tempRegOpnd);
  ThrowIfScriptClosed(this);
  AutoCodeGenPhase::AutoCodeGenPhase((AutoCodeGenPhase *)(peeps.regMap + 0x20),this,PeepsPhase);
  Peeps::Peeps((Peeps *)&__autoCodeGen_10.phase,this);
  Peeps::PeepFunc((Peeps *)&__autoCodeGen_10.phase);
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)(peeps.regMap + 0x20),this,PeepsPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)(peeps.regMap + 0x20));
  AutoCodeGenPhase::AutoCodeGenPhase((AutoCodeGenPhase *)&layout.currentStatement,this,LayoutPhase);
  SimpleLayout::SimpleLayout((SimpleLayout *)&__autoCodeGen_11.phase,this);
  SimpleLayout::Layout((SimpleLayout *)&__autoCodeGen_11.phase);
  AutoCodeGenPhase::EndPhase
            ((AutoCodeGenPhase *)&layout.currentStatement,this,LayoutPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)&layout.currentStatement);
  BVar5 = HasTry(this);
  if ((BVar5 != 0) && ((*(uint *)&this->field_0x240 >> 5 & 1) != 0)) {
    AutoCodeGenPhase::AutoCodeGenPhase
              ((AutoCodeGenPhase *)&__autoCodeGen_12.phase,this,EHBailoutPatchUpPhase);
    Lowerer::EHBailoutPatchUp((Lowerer *)&__autoCodeGen_5.phase);
    AutoCodeGenPhase::EndPhase
              ((AutoCodeGenPhase *)&__autoCodeGen_12.phase,this,EHBailoutPatchUpPhase,true,true);
    AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)&__autoCodeGen_12.phase);
  }
  AutoCodeGenPhase::AutoCodeGenPhase
            ((AutoCodeGenPhase *)&__autoCodeGen_13.phase,this,InsertNOPsPhase);
  Security::InsertNOPs((Security *)&__autoCodeGen_6.phase);
  AutoCodeGenPhase::EndPhase
            ((AutoCodeGenPhase *)&__autoCodeGen_13.phase,this,InsertNOPsPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)&__autoCodeGen_13.phase);
  AutoCodeGenPhase::AutoCodeGenPhase
            ((AutoCodeGenPhase *)&__autoCodeGen_14.phase,this,PrologEpilogPhase);
  pJVar6 = GetJITFunctionBody(this);
  bVar4 = JITTimeFunctionBody::IsAsmJsMode(pJVar6);
  if (bVar4) {
    Lowerer::LowerPrologEpilogAsmJs((Lowerer *)&__autoCodeGen_5.phase);
  }
  else {
    Lowerer::LowerPrologEpilog((Lowerer *)&__autoCodeGen_5.phase);
  }
  AutoCodeGenPhase::EndPhase
            ((AutoCodeGenPhase *)&__autoCodeGen_14.phase,this,PrologEpilogPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)&__autoCodeGen_14.phase);
  AutoCodeGenPhase::AutoCodeGenPhase
            ((AutoCodeGenPhase *)&__autoCodeGen_15.phase,this,FinalLowerPhase);
  Lowerer::FinalLower((Lowerer *)&__autoCodeGen_5.phase);
  AutoCodeGenPhase::EndPhase
            ((AutoCodeGenPhase *)&__autoCodeGen_15.phase,this,FinalLowerPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)&__autoCodeGen_15.phase);
  AutoCodeGenPhase::AutoCodeGenPhase
            ((AutoCodeGenPhase *)&encoder.m_inlineeFrameRecords,this,EncoderPhase);
  Encoder::Encoder((Encoder *)&oldFile,this);
  Encoder::Encode((Encoder *)&oldFile);
  AutoCodeGenPhase::EndPhase
            ((AutoCodeGenPhase *)&encoder.m_inlineeFrameRecords,this,EncoderPhase,false,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)&encoder.m_inlineeFrameRecords);
  Lowerer::~Lowerer((Lowerer *)&__autoCodeGen_5.phase);
  bVar4 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,AsmDumpModeFlag);
  if (bVar4) {
    asmFile = (PAL_FILE *)0x0;
    this_01 = GetScriptContext(this);
    pNVar8 = Js::ScriptContext::GetNativeCodeGenerator(this_01);
    file = pNVar8->asmFile;
    if (file != (PAL_FILE *)0x0) {
      asmFile = Output::SetFile(file);
    }
    Dump(this,IRDumpFlags_AsmDumpMode);
    Output::Flush();
    if ((file != (PAL_FILE *)0x0) &&
       (__autoCodeGen_16._8_8_ = Output::SetFile(asmFile),
       (PAL_FILE *)__autoCodeGen_16._8_8_ != file)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x24c,"(openedFile == asmFile)","openedFile == asmFile");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
  }
  bVar4 = IsOOPJIT(this);
  if (bVar4) {
    AutoCodeGenPhase::AutoCodeGenPhase((AutoCodeGenPhase *)&dataAllocator,this,NativeCodeDataPhase);
    pAVar10 = GetNativeCodeDataAllocator(this);
    if (pAVar10->allocCount != 0) {
      pDVar2 = (pAVar10->field_0).chunkList;
      for (next2 = pDVar2; next2 != (DataChunk *)0x0; next2 = next2->next) {
        if (next2->fixupFunc != (_func_void_void_ptr_DataChunk_ptr *)0x0) {
          (*next2->fixupFunc)(next2 + 1,pDVar2);
        }
        pDStack_ec8 = pDVar2;
        if ((DAT_01e9e22a & 1) != 0) {
          for (; pDStack_ec8 != (DataChunk *)0x0; pDStack_ec8 = pDStack_ec8->next) {
            for (jitOutputData._4_4_ = 0; jitOutputData._4_4_ < next2->len >> 3;
                jitOutputData._4_4_ = jitOutputData._4_4_ + 1) {
              if (*(DataChunk **)(&next2[1].len + (ulong)jitOutputData._4_4_ * 2) == pDStack_ec8 + 1
                 ) {
                NativeCodeData::VerifyExistFixupEntry
                          (pDStack_ec8 + 1,&next2[1].len + (ulong)jitOutputData._4_4_ * 2,next2 + 1)
                ;
              }
            }
          }
        }
      }
      pJVar11 = JITOutput::GetOutputData(&this->m_output);
      uVar1 = pAVar10->allocCount;
      pVVar12 = GetProcessHeap();
      pNVar13 = (NativeDataFixupTable *)HeapAlloc(pVVar12,0,(ulong)uVar1 * 0x18 + 8);
      pJVar11->nativeDataFixupTable = pNVar13;
      if (pJVar11->nativeDataFixupTable == (NativeDataFixupTable *)0x0) {
        Js::Throw::OutOfMemory();
      }
      pJVar11->nativeDataFixupTable->count = pAVar10->allocCount;
      pVVar12 = GetProcessHeap();
      pNVar14 = (NativeDataBuffer *)HeapAlloc(pVVar12,0,(ulong)pAVar10->totalSize + 8);
      pJVar11->buffer = pNVar14;
      if (pJVar11->buffer == (NativeDataBuffer *)0x0) {
        Js::Throw::OutOfMemory();
      }
      pJVar11->buffer->len = pAVar10->totalSize;
      local_ee4 = 0;
      local_ee8 = 0;
      for (next2 = pDVar2; next2 != (DataChunk *)0x0; next2 = next2->next) {
        memcpy((void *)((long)&pJVar11->buffer[1].len + (ulong)local_ee4),next2 + 1,
               (ulong)next2->len);
        local_ee4 = next2->len + local_ee4;
        pJVar11->nativeDataFixupTable[(ulong)local_ee8 * 3 + 1].count = next2->allocIndex;
        pJVar11->nativeDataFixupTable[(ulong)local_ee8 * 3 + 1].struct_pad_0 = next2->len;
        pJVar11->nativeDataFixupTable[(ulong)local_ee8 * 3 + 2].count = next2->offset;
        pJVar11->nativeDataFixupTable[(ulong)local_ee8 * 3 + 3] =
             (NativeDataFixupTable)next2->fixupList;
        local_ee8 = local_ee8 + 1;
      }
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,NativeCodeDataPhase);
      if (bVar4) {
        Output::Print(L"NativeCodeData Server Buffer: %p, len: %x, chunk head: %p\n",
                      pJVar11->buffer + 1,(ulong)pJVar11->buffer->len,pDVar2);
      }
    }
    AutoCodeGenPhase::EndPhase
              ((AutoCodeGenPhase *)&dataAllocator,this,NativeCodeDataPhase,true,true);
    AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)&dataAllocator);
  }
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)&__autoCodeGen_1.phase,this,BackEndPhase,true,true)
  ;
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)&__autoCodeGen_1.phase);
  return;
}

Assistant:

void
Func::TryCodegen()
{
    Assert(!IsJitInDebugMode() || !GetJITFunctionBody()->HasTry());

    BEGIN_CODEGEN_PHASE(this, Js::BackEndPhase);
    {
        // IRBuilder

        BEGIN_CODEGEN_PHASE(this, Js::IRBuilderPhase);

#ifdef ASMJS_PLAT
        if (GetJITFunctionBody()->IsAsmJsMode())
        {
            IRBuilderAsmJs asmIrBuilder(this);
            asmIrBuilder.Build();
        }
        else
#endif
        {
            IRBuilder irBuilder(this);
            irBuilder.Build();
        }

        END_CODEGEN_PHASE(this, Js::IRBuilderPhase);

#ifdef IR_VIEWER
        IRtoJSObjectBuilder::DumpIRtoGlobalObject(this, Js::IRBuilderPhase);
#endif /* IR_VIEWER */

        BEGIN_CODEGEN_PHASE(this, Js::InlinePhase);

        InliningHeuristics heuristics(GetWorkItem()->GetJITTimeInfo(), this->IsLoopBody());
        Inline inliner(this, heuristics);
        inliner.Optimize();

        END_CODEGEN_PHASE(this, Js::InlinePhase);

        ThrowIfScriptClosed();

        // FlowGraph
        {
            // Scope for FlowGraph arena
            NoRecoverMemoryJitArenaAllocator fgAlloc(_u("BE-FlowGraph"), m_alloc->GetPageAllocator(), Js::Throw::OutOfMemory);

            BEGIN_CODEGEN_PHASE(this, Js::FGBuildPhase);

            this->m_fg = FlowGraph::New(this, &fgAlloc);
            this->m_fg->Build();

            END_CODEGEN_PHASE(this, Js::FGBuildPhase);

            // Global Optimization and Type Specialization
            BEGIN_CODEGEN_PHASE(this, Js::GlobOptPhase);

            GlobOpt globOpt(this);
            globOpt.Optimize();

            END_CODEGEN_PHASE(this, Js::GlobOptPhase);

            // Delete flowGraph now
            this->m_fg->Destroy();
            this->m_fg = nullptr;
        }

#ifdef IR_VIEWER
        IRtoJSObjectBuilder::DumpIRtoGlobalObject(this, Js::GlobOptPhase);
#endif /* IR_VIEWER */

        ThrowIfScriptClosed();

        // Lowering
        Lowerer lowerer(this);
        BEGIN_CODEGEN_PHASE(this, Js::LowererPhase);
        lowerer.Lower();
        END_CODEGEN_PHASE(this, Js::LowererPhase);

#ifdef IR_VIEWER
        IRtoJSObjectBuilder::DumpIRtoGlobalObject(this, Js::LowererPhase);
#endif /* IR_VIEWER */

        // Encode constants

        Security security(this);

        BEGIN_CODEGEN_PHASE(this, Js::EncodeConstantsPhase)
        security.EncodeLargeConstants();
        END_CODEGEN_PHASE(this, Js::EncodeConstantsPhase);
        if (GetJITFunctionBody()->DoInterruptProbe())
        {
            BEGIN_CODEGEN_PHASE(this, Js::InterruptProbePhase)
            lowerer.DoInterruptProbes();
            END_CODEGEN_PHASE(this, Js::InterruptProbePhase)
        }

        // Register Allocation

        BEGIN_CODEGEN_PHASE(this, Js::RegAllocPhase);

        LinearScan linearScan(this);
        linearScan.RegAlloc();

        END_CODEGEN_PHASE(this, Js::RegAllocPhase);

#ifdef IR_VIEWER
        IRtoJSObjectBuilder::DumpIRtoGlobalObject(this, Js::RegAllocPhase);
#endif /* IR_VIEWER */

        ThrowIfScriptClosed();

        // Peephole optimizations

        BEGIN_CODEGEN_PHASE(this, Js::PeepsPhase);

        Peeps peeps(this);
        peeps.PeepFunc();

        END_CODEGEN_PHASE(this, Js::PeepsPhase);

        // Layout

        BEGIN_CODEGEN_PHASE(this, Js::LayoutPhase);

        SimpleLayout layout(this);
        layout.Layout();

        END_CODEGEN_PHASE(this, Js::LayoutPhase);

        if (this->HasTry() && this->hasBailoutInEHRegion)
        {
            BEGIN_CODEGEN_PHASE(this, Js::EHBailoutPatchUpPhase);
            lowerer.EHBailoutPatchUp();
            END_CODEGEN_PHASE(this, Js::EHBailoutPatchUpPhase);
        }

        // Insert NOPs (moving this before prolog/epilog for AMD64 and possibly ARM).
        BEGIN_CODEGEN_PHASE(this, Js::InsertNOPsPhase);
        security.InsertNOPs();
        END_CODEGEN_PHASE(this, Js::InsertNOPsPhase);

        // Prolog/Epilog
        BEGIN_CODEGEN_PHASE(this, Js::PrologEpilogPhase);
        if (GetJITFunctionBody()->IsAsmJsMode())
        {
            lowerer.LowerPrologEpilogAsmJs();
        }
        else
        {
            lowerer.LowerPrologEpilog();
        }
        END_CODEGEN_PHASE(this, Js::PrologEpilogPhase);

        BEGIN_CODEGEN_PHASE(this, Js::FinalLowerPhase);
        lowerer.FinalLower();
        END_CODEGEN_PHASE(this, Js::FinalLowerPhase);

        // Encoder
        BEGIN_CODEGEN_PHASE(this, Js::EncoderPhase);

        Encoder encoder(this);
        encoder.Encode();

        END_CODEGEN_PHASE_NO_DUMP(this, Js::EncoderPhase);

#ifdef IR_VIEWER
        IRtoJSObjectBuilder::DumpIRtoGlobalObject(this, Js::EncoderPhase);
#endif /* IR_VIEWER */

    }

#if DBG_DUMP
    if (Js::Configuration::Global.flags.IsEnabled(Js::AsmDumpModeFlag))
    {
        FILE * oldFile = 0;
        FILE * asmFile = GetScriptContext()->GetNativeCodeGenerator()->asmFile;
        if (asmFile)
        {
            oldFile = Output::SetFile(asmFile);
        }

        this->Dump(IRDumpFlags_AsmDumpMode);

        Output::Flush();

        if (asmFile)
        {
            FILE *openedFile = Output::SetFile(oldFile);
            Assert(openedFile == asmFile);
        }
    }
#endif
    if (this->IsOOPJIT())
    {
        BEGIN_CODEGEN_PHASE(this, Js::NativeCodeDataPhase);

        auto dataAllocator = this->GetNativeCodeDataAllocator();
        if (dataAllocator->allocCount > 0)
        {
            NativeCodeData::DataChunk *chunk = (NativeCodeData::DataChunk*)dataAllocator->chunkList;
            NativeCodeData::DataChunk *next1 = chunk;
            while (next1)
            {
                if (next1->fixupFunc)
                {
                    next1->fixupFunc(next1->data, chunk);
                }
#if DBG
                if (CONFIG_FLAG(OOPJITFixupValidate))
                {
                    // Scan memory to see if there's missing pointer needs to be fixed up
                    // This can hit false positive if some data field happens to have value 
                    // falls into the NativeCodeData memory range.
                    NativeCodeData::DataChunk *next2 = chunk;
                    while (next2)
                    {
                        for (unsigned int i = 0; i < next1->len / sizeof(void*); i++)
                        {
                            if (((void**)next1->data)[i] == (void*)next2->data)
                            {
                                NativeCodeData::VerifyExistFixupEntry((void*)next2->data, &((void**)next1->data)[i], next1->data);
                            }
                        }
                        next2 = next2->next;
                    }
                }
#endif
                next1 = next1->next;
            }

            JITOutputIDL* jitOutputData = m_output.GetOutputData();
            size_t allocSize = offsetof(NativeDataFixupTable, fixupRecords) + sizeof(NativeDataFixupRecord)* (dataAllocator->allocCount);
            jitOutputData->nativeDataFixupTable = (NativeDataFixupTable*)midl_user_allocate(allocSize);
            if (!jitOutputData->nativeDataFixupTable)
            {
                Js::Throw::OutOfMemory();
            }
            __analysis_assume(jitOutputData->nativeDataFixupTable);
            jitOutputData->nativeDataFixupTable->count = dataAllocator->allocCount;

            jitOutputData->buffer = (NativeDataBuffer*)midl_user_allocate(offsetof(NativeDataBuffer, data) + dataAllocator->totalSize);
            if (!jitOutputData->buffer)
            {
                Js::Throw::OutOfMemory();
            }
            __analysis_assume(jitOutputData->buffer);

            jitOutputData->buffer->len = dataAllocator->totalSize;

            unsigned int len = 0;
            unsigned int count = 0;
            next1 = chunk;
            while (next1)
            {
                memcpy(jitOutputData->buffer->data + len, next1->data, next1->len);
                len += next1->len;

                jitOutputData->nativeDataFixupTable->fixupRecords[count].index = next1->allocIndex;
                jitOutputData->nativeDataFixupTable->fixupRecords[count].length = next1->len;
                jitOutputData->nativeDataFixupTable->fixupRecords[count].startOffset = next1->offset;
                jitOutputData->nativeDataFixupTable->fixupRecords[count].updateList = next1->fixupList;

                count++;
                next1 = next1->next;
            }

#if DBG
            if (PHASE_TRACE1(Js::NativeCodeDataPhase))
            {
                Output::Print(_u("NativeCodeData Server Buffer: %p, len: %x, chunk head: %p\n"), jitOutputData->buffer->data, jitOutputData->buffer->len, chunk);
            }
#endif
        }
        END_CODEGEN_PHASE(this, Js::NativeCodeDataPhase);
    }

    END_CODEGEN_PHASE(this, Js::BackEndPhase);
}